

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O0

void __thiscall QPrintPreviewDialogPrivate::updateZoomFactor(QPrintPreviewDialogPrivate *this)

{
  long lVar1;
  QString *pQVar2;
  QPrintPreviewWidget *in_RDI;
  long in_FS_OFFSET;
  double in_stack_ffffffffffffffe8;
  QPrintPreviewDialogPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QString *)QComboBox::lineEdit();
  QPrintPreviewWidget::zoomFactor(in_RDI);
  formattedZoomFactor(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  QLineEdit::setText(pQVar2);
  QString::~QString((QString *)0x17e653);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::updateZoomFactor()
{
    zoomFactor->lineEdit()->setText(formattedZoomFactor(preview->zoomFactor() * 100));
}